

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

qsizetype __thiscall QHttp2Connection::numActiveStreamsImpl(QHttp2Connection *this,quint32 mask)

{
  long lVar1;
  long lVar2;
  qsizetype qVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  lVar4 = *(long *)(this + 0x1c0);
  if (lVar4 == 0) {
    lVar4 = 0;
    uVar5 = 0;
  }
  else {
    if (**(char **)(lVar4 + 0x20) != -1) {
      uVar5 = 0;
      goto LAB_001e8bc2;
    }
    uVar7 = 1;
    do {
      uVar5 = uVar7;
      if (*(ulong *)(lVar4 + 0x10) == uVar5) {
        lVar4 = 0;
        uVar5 = 0;
        break;
      }
      uVar7 = uVar5 + 1;
    } while ((*(char **)(lVar4 + 0x20))[(ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90] == -1);
  }
  if (lVar4 == 0 && uVar5 == 0) {
    return 0;
  }
LAB_001e8bc2:
  qVar3 = 0;
  do {
    lVar1 = *(long *)(lVar4 + 0x20);
    lVar6 = (uVar5 >> 7) * 0x90;
    lVar2 = *(long *)(lVar1 + 0x80 + lVar6);
    uVar7 = (ulong)*(byte *)((ulong)((uint)uVar5 & 0x7f) + lVar1 + lVar6);
    lVar6 = *(long *)(lVar2 + 8 + uVar7 * 0x18);
    if ((((lVar6 != 0) && (*(int *)(lVar6 + 4) != 0)) &&
        (lVar2 = *(long *)(lVar2 + 0x10 + uVar7 * 0x18), lVar2 != 0)) &&
       ((*(uint *)(lVar2 + 0x10) & 1) == mask)) {
      qVar3 = qVar3 + (ulong)(*(int *)(lVar2 + 0x68) != 0 && *(int *)(lVar2 + 0x68) != 5);
    }
    do {
      if (*(long *)(lVar4 + 0x10) - 1U == uVar5) {
        uVar5 = 0;
        lVar4 = 0;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (*(char *)((ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90 + lVar1) == -1);
    if ((uVar5 == 0) && (lVar4 == 0)) {
      return qVar3;
    }
  } while( true );
}

Assistant:

inline const_iterator cbegin() const noexcept { return d ? const_iterator(d->begin()): const_iterator(); }